

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.h
# Opt level: O3

void __thiscall
Environment::Update(Environment *this,
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *particles)

{
  double *pdVar1;
  pointer pvVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  Mat Env;
  long *local_d8;
  undefined8 uStack_d0;
  long local_c8 [2];
  int local_b8;
  int local_b4;
  _InputArray local_b0;
  Point local_98;
  Mat local_90 [96];
  
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_d8 = (long *)0x0;
  uStack_d0 = 0;
  cv::Mat::Mat(local_90,0x1e0,0x280,0x10,(Scalar_ *)&local_d8);
  local_b0.sz.width = 0;
  local_b0.sz.height = 0;
  local_b0.flags = 0x3010000;
  local_98 = this->goal;
  local_d8 = (long *)0x0;
  uStack_d0 = 0x406fe00000000000;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_b0.obj = local_90;
  cv::circle(&local_b0,&local_98,8,&local_d8,0xffffffff,8,0);
  pvVar2 = (particles->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((particles->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar2) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      local_b0.sz.width = 0;
      local_b0.sz.height = 0;
      local_b0.flags = 0x3010000;
      local_b0.obj = local_90;
      pdVar1 = *(double **)
                ((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar4);
      local_b8 = (int)ROUND(*pdVar1);
      local_b4 = (int)ROUND(pdVar1[1]);
      local_d8 = (long *)0x406fe00000000000;
      uStack_d0 = 0x406fe00000000000;
      local_c8[0] = 0x406fe00000000000;
      local_c8[1] = 0;
      cv::circle(&local_b0,&local_b8,8,&local_d8,0xffffffff,8,0);
      uVar5 = uVar5 + 1;
      pvVar2 = (particles->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(particles->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
              -0x5555555555555555;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 <= uVar3 && uVar3 - uVar5 != 0);
  }
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Environment","");
  local_b0.sz.width = 0;
  local_b0.sz.height = 0;
  local_b0.flags = 0x1010000;
  local_b0.obj = local_90;
  cv::imshow((string *)&local_d8,&local_b0);
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  cv::waitKey(300);
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void Environment::Update( vector <vector<double> > particles )
{
    Mat Env( 480, 640, CV_8UC3, Scalar(0, 0, 0) );
    circle( Env, goal, 8.0, Scalar( 0, 255, 0 ), -1, 8 );
    for( int i = 0; i < particles.size(); i++ )
    {
        circle( Env, Point2d( particles[i][0], particles[i][1] ), 8.0, Scalar( 255, 255, 255 ), -1, 8 );
    }
    imshow("Environment", Env);
    waitKey(300);
}